

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void helics::
     loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>
               (Federate *fed,
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *data,Filter *iface)

{
  string_view info_00;
  string_view defVal;
  anon_class_16_2_14a9c628 callback;
  bool bVar1;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_00000158;
  json *in_stack_00000160;
  string info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd68;
  Interface *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  json *in_stack_fffffffffffffd88;
  allocator<char> *in_stack_fffffffffffffd90;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_211 [40];
  allocator<char> local_1e9 [33];
  char *local_1c8;
  allocator<char> local_1b9;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  Filter *in_stack_fffffffffffffe58;
  anon_class_8_1_a8116966 in_stack_fffffffffffffe60;
  allocator<char> local_191 [33];
  char *local_170;
  allocator<char> local_168 [32];
  __sv_type local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  function<void_(int,_int)> *in_stack_fffffffffffffed8;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffee0;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffee8;
  json *in_stack_fffffffffffffef0;
  allocator<char> local_39 [33];
  char *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  callback.fed = (Federate *)in_stack_fffffffffffffe60.iface;
  callback.iface = in_stack_fffffffffffffe58;
  addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_1_>
            ((json *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator(local_39);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_2_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_3_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::function<void(int,int)>::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(int,int)_1_,void>
            ((function<void_(int,_int)> *)in_stack_fffffffffffffd70,
             (anon_class_8_1_a8116966 *)in_stack_fffffffffffffd68);
  processOptions(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8);
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x226e80);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x226e8d);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x226e9a);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  local_138 = 0;
  uStack_130 = 0;
  defVal._M_str = in_stack_fffffffffffffd98;
  defVal._M_len = (size_t)in_stack_fffffffffffffd90;
  fileops::getOrDefault(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,defVal);
  std::__cxx11::string::~string(in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x226f32);
  if (!bVar1) {
    in_stack_fffffffffffffd98 = local_18;
    local_148 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd60);
    info_00._M_str = (char *)in_stack_fffffffffffffd80;
    info_00._M_len = in_stack_fffffffffffffd78;
    Interface::setInfo(in_stack_fffffffffffffd70,info_00);
  }
  local_170 = local_18;
  __a = local_168;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_fffffffffffffd70,(anon_class_8_1_a8116966 *)in_stack_fffffffffffffd68);
  loadTags(in_stack_00000160,in_stack_00000158);
  std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x2270c5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,in_stack_fffffffffffffd98,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,in_stack_fffffffffffffd98,__a);
  local_1c8 = local_18;
  addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string(in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator(local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,in_stack_fffffffffffffd98,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,in_stack_fffffffffffffd98,__a);
  addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(local_10);
  std::allocator<char>::~allocator(local_211);
  std::__cxx11::string::~string(local_10);
  std::allocator<char>::~allocator(local_1e9);
  std::__cxx11::string::~string(local_10);
  return;
}

Assistant:

static void loadOptions(Federate* fed, const Inp& data, INTERFACE& iface)
{
    addTargets(data, "flags", [&iface, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a recognized flag");
            return;
        }
        iface.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&iface](int32_t option, int32_t value) { iface.setOption(option, value); });

    auto info = fileops::getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        iface.setInfo(info);
    }
    loadTags(data, [&iface](std::string_view tagname, std::string_view tagvalue) {
        iface.setTag(tagname, tagvalue);
    });

    addTargetVariations(data, "source", "targets", [&iface](const std::string& target) {
        iface.addSourceTarget(target);
    });
    addTargetVariations(data, "destination", "targets", [&iface](const std::string& target) {
        iface.addDestinationTarget(target);
    });
}